

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

ReturnType * __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)9>
          (ParameterDictionary *this,string *name,ReturnType *defaultValue)

{
  ParsedParameter *param;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t sVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RCX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  ReturnType *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values;
  ParsedParameter *p;
  const_iterator __end2;
  const_iterator __begin2;
  ParsedParameterVector *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  ReturnType *s;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *loc;
  
  s = in_RDI;
  loc = in_RCX;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
         ::begin(in_RSI);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
           ::end(in_RCX);
  while( true ) {
    if (args == pbVar2) {
      std::__cxx11::string::string((string *)s,(string *)in_RCX);
      return in_RDI;
    }
    param = *(ParsedParameter **)args;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX,in_stack_ffffffffffffff98);
    if ((!bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_RCX,(char *)in_stack_ffffffffffffff98), !bVar1)) break;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &args->_M_string_length;
  }
  this_00 = ParameterTypeTraits<(pbrt::ParameterType)9>::GetValues_abi_cxx11_(param);
  bVar1 = pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x754c1b);
  if (!bVar1) {
    sVar3 = pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_00);
    if (sVar3 < 2) {
      param->lookedUp = true;
      pstd::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::data(this_00);
      ParameterTypeTraits<(pbrt::ParameterType)9>::Convert(s,(FileLoc *)in_RCX);
      return in_RDI;
    }
    ErrorExit<std::__cxx11::string_const&>((FileLoc *)loc,(char *)in_RSI,args);
  }
  ErrorExit<std::__cxx11::string_const&>((FileLoc *)loc,(char *)in_RSI,args);
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() > traits::nPerItem)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}